

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O2

void tvm::contrib::topk<int,long>
               (DLTensor *input,DLTensor *out_values,DLTensor *out_indices,int k,int axis,
               bool is_ascend)

{
  void *pvVar1;
  uint uVar2;
  pointer ppVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  code *__comp;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  void *pvVar15;
  long lVar16;
  void *pvVar17;
  int *piVar18;
  long lVar19;
  bool bVar20;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> sorter;
  long local_98;
  pair<long,_int> local_40;
  
  if (out_values == (DLTensor *)0x0) {
    pvVar14 = (void *)0x0;
  }
  else {
    pvVar14 = out_values->data;
  }
  uVar12 = 0;
  if (out_indices == (DLTensor *)0x0) {
    pvVar15 = (void *)0x0;
  }
  else {
    pvVar15 = out_indices->data;
  }
  pvVar1 = input->data;
  sorter.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sorter.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sorter.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar19 = (long)axis;
  uVar11 = (ulong)(uint)input->ndim;
  if (input->ndim < 1) {
    uVar11 = uVar12;
  }
  uVar2 = 1;
  uVar13 = 1;
  while( true ) {
    if (uVar11 == uVar12) break;
    if ((long)uVar12 < lVar19) {
      uVar13 = (ulong)(uint)((int)uVar13 * (int)input->shape[uVar12]);
    }
    else if (lVar19 < (long)uVar12) {
      uVar2 = uVar2 * (int)input->shape[uVar12];
    }
    uVar12 = uVar12 + 1;
  }
  if (k < 1) {
    k = *(int *)(input->shape + lVar19);
  }
  uVar12 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
  }
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  __comp = CompareDescend<int>;
  if (is_ascend) {
    __comp = CompareAscend<int>;
  }
  lVar16 = (long)(int)uVar2 * 4;
  iVar6 = 0;
  local_98 = 0;
  ppVar3 = (pointer)0x0;
  for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
    pvVar17 = (void *)((long)pvVar15 + (long)iVar6 * 8);
    pvVar9 = (void *)((long)pvVar14 + (long)iVar6 * 4);
    pvVar5 = pvVar1;
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      if (sorter.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppVar3) {
        sorter.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar3;
      }
      lVar10 = input->shape[lVar19];
      piVar18 = (int *)(local_98 * lVar10 + (long)pvVar5);
      for (lVar8 = 0; lVar8 < lVar10; lVar8 = lVar8 + 1) {
        local_40.second = *piVar18;
        local_40.first = lVar8;
        std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
        emplace_back<std::pair<long,int>>
                  ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&sorter,
                   &local_40);
        lVar10 = input->shape[lVar19];
        piVar18 = piVar18 + (int)uVar2;
      }
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,int>const&,std::pair<long,int>const&)>>
                ((__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                  )sorter.
                   super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<long,_int>_*,_std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>_>
                  )sorter.
                   super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<long,_int>_&,_const_std::pair<long,_int>_&)>
                  )__comp);
      uVar4 = (ulong)(uint)k;
      if (k < 1) {
        uVar4 = input->shape[lVar19];
      }
      if ((long)uVar4 < 1) {
        uVar4 = 0;
      }
      piVar18 = &(sorter.
                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->second;
      lVar10 = 0;
      while (bVar20 = uVar4 != 0, uVar4 = uVar4 - 1, bVar20) {
        if (pvVar15 != (void *)0x0) {
          *(long *)((long)pvVar17 + lVar10 * 2) = ((pair<long,_int> *)(piVar18 + -2))->first;
        }
        if (pvVar14 != (void *)0x0) {
          *(int *)((long)pvVar9 + lVar10) = *piVar18;
        }
        piVar18 = piVar18 + 4;
        lVar10 = lVar10 + lVar16;
      }
      pvVar5 = (void *)((long)pvVar5 + 4);
      pvVar17 = (void *)((long)pvVar17 + 8);
      pvVar9 = (void *)((long)pvVar9 + 4);
      ppVar3 = sorter.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    local_98 = local_98 + lVar16;
    iVar6 = iVar6 + k * uVar2;
  }
  std::_Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~_Vector_base
            (&sorter.
              super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>);
  return;
}

Assistant:

void topk(DLTensor *input,
          DLTensor *out_values,
          DLTensor *out_indices,
          int k,
          int axis,
          bool is_ascend) {
  DataType *data_ptr = static_cast<DataType *>(input->data);
  DataType *values_ptr = (out_values == nullptr) ? nullptr : static_cast<DataType *>(out_values->data);
  IndicesType *indices_ptr = (out_indices == nullptr) ? nullptr : static_cast<IndicesType *>(out_indices->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }
  if (k < 1) {
    k = input->shape[axis];
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t src_base_idx = i * input->shape[axis] * axis_mul_after + j;
      int64_t dst_base_idx = i * k * axis_mul_after + j;
      for (int64_t kk = 0; kk < input->shape[axis]; ++kk) {
        int64_t full_idx = src_base_idx + kk * axis_mul_after;
        sorter.emplace_back(std::make_pair(kk, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      int64_t cnt = k > 0 ? k : input->shape[axis];
      for (int64_t kk = 0; kk < cnt; ++kk) {
        if (indices_ptr != nullptr) {
          indices_ptr[dst_base_idx + kk * axis_mul_after] =
              static_cast<IndicesType>(sorter[kk].first);
        }
        if (values_ptr != nullptr) {
          values_ptr[dst_base_idx + kk * axis_mul_after] =
              static_cast<DataType>(sorter[kk].second);
        }
      }
    }
  }
}